

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O1

Result * __thiscall
CoreML::OneHotEncoder::setFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<long,_std::allocator<long>_> *container)

{
  int iVar1;
  Model *this_00;
  long *plVar2;
  long lVar3;
  OneHotEncoder *pOVar4;
  Int64Vector *pIVar5;
  long *plVar6;
  
  this_00 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] != 600) {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 600;
    pOVar4 = (OneHotEncoder *)operator_new(0x28);
    Specification::OneHotEncoder::OneHotEncoder(pOVar4);
    (this_00->Type_).onehotencoder_ = pOVar4;
  }
  pOVar4 = (this_00->Type_).onehotencoder_;
  if (pOVar4->_oneof_case_[0] == 2) {
    if ((pOVar4->CategoryType_).stringcategories_ != (StringVector *)0x0) {
      (*(((pOVar4->CategoryType_).stringcategories_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    pOVar4->_oneof_case_[0] = 0;
  }
  plVar2 = (container->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (plVar6 = (container->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_start; plVar6 != plVar2; plVar6 = plVar6 + 1) {
    lVar3 = *plVar6;
    if (pOVar4->_oneof_case_[0] != 2) {
      Specification::OneHotEncoder::clear_CategoryType(pOVar4);
      pOVar4->_oneof_case_[0] = 2;
      pIVar5 = (Int64Vector *)operator_new(0x28);
      Specification::Int64Vector::Int64Vector(pIVar5);
      (pOVar4->CategoryType_).int64categories_ = pIVar5;
    }
    pIVar5 = (pOVar4->CategoryType_).int64categories_;
    iVar1 = (pIVar5->vector_).total_size_;
    if ((pIVar5->vector_).current_size_ == iVar1) {
      google::protobuf::RepeatedField<long>::Reserve(&pIVar5->vector_,iVar1 + 1);
    }
    iVar1 = (pIVar5->vector_).current_size_;
    (pIVar5->vector_).current_size_ = iVar1 + 1;
    ((pIVar5->vector_).rep_)->elements[iVar1] = lVar3;
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::setFeatureEncoding(const std::vector<int64_t>& container) {
        auto ohe = m_spec->mutable_onehotencoder();
        ohe->clear_int64categories();

        for (auto element : container) {
            ohe->mutable_int64categories()->add_vector(element);
        }
        return Result();
    }